

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  IdealDiffuseBxDF *pIVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  BxDFFlags BVar10;
  uint64_t sequenceIndex;
  uint64_t seed;
  BSDFSample *pBVar11;
  uint uVar12;
  pbrt *this_00;
  optional<pbrt::BSDFSample> *this_01;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  Float FVar16;
  Float FVar17;
  undefined1 auVar18 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar19 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar20 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar21 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar22 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar23 [64];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar24 [64];
  float fVar25;
  undefined1 auVar26 [16];
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3<float> VVar27;
  Vector3<float> VVar28;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Tuple3<pbrt::Vector3,_float> wo_06;
  Tuple3<pbrt::Vector3,_float> wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  float local_1ac;
  Float g;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> rInterface;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  ulong local_148;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_128;
  float local_10c;
  undefined1 local_108 [16];
  optional<pbrt::BSDFSample> wis;
  anon_class_8_1_ba1d750b r;
  optional<pbrt::BSDFSample> rs;
  optional<pbrt::BSDFSample> wos;
  RNG rng;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  local_168 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_148 = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  fVar25 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._8_56_ = wo._8_56_;
  auVar19._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_108 = auVar19._0_16_;
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.h"
               ,0x330,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  if (((this->config).twoSided == '\0') || (0.0 <= fVar25)) {
    uStack_160 = 0;
    uStack_164 = in_XMM3_Db;
    uStack_15c = in_XMM3_Dd;
  }
  else {
    local_148 = local_148 ^ 0x8000000080000000;
    local_168 = -(float)local_168;
    uStack_164 = in_XMM3_Db ^ 0x80000000;
    uStack_15c = in_XMM3_Dd ^ 0x80000000;
    local_108._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
    local_108._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    local_108._12_4_ = wo._12_4_ ^ 0x80000000;
    fVar25 = -fVar25;
    uStack_160 = 0x80000000;
  }
  this_00 = (pbrt *)(ulong)*Options;
  VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_108._0_8_;
  VVar27.super_Tuple3<pbrt::Vector3,_float>.z = fVar25;
  sequenceIndex = Hash<int,pbrt::Vector3<float>>(*Options,VVar27);
  VVar28.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_168;
  VVar28.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_148;
  VVar28.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_148._4_4_;
  seed = Hash<pbrt::Vector3<float>>(this_00,VVar28);
  RNG::SetSequence(&rng,sequenceIndex,seed);
  auVar3 = local_108;
  auVar13._4_4_ = uStack_164;
  auVar13._0_4_ = local_168;
  auVar13._8_4_ = uStack_160;
  auVar13._12_4_ = uStack_15c;
  local_10c = (float)local_168 * fVar25;
  local_1ac = 0.0;
  r.rng = &rng;
  if (0.0 < local_10c) {
    bVar2 = (this->config).nSamples;
    if (fVar25 <= 0.0) {
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx512vl(auVar13,auVar3);
      fVar14 = auVar13._0_4_ * 0.31830987;
    }
    else {
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar25;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_108._0_4_;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_168;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_148;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_148._4_4_;
      local_108 = auVar3;
      fVar14 = DielectricInterfaceBxDF::PDF
                         (&this->top,wo_00,wi_01,(TransportMode)sequenceIndex,Reflection);
    }
    local_1ac = fVar14 * (float)bVar2 + 0.0;
  }
  pIVar1 = &this->bottom;
  uVar12 = 0;
  do {
    bVar2 = (this->config).nSamples;
    if (bVar2 <= uVar12) {
      return (local_1ac / (float)bVar2) * 0.9 + 0.007957749;
    }
    rInterface.bottom = pIVar1;
    rInterface.top = &this->top;
    if (local_10c <= 0.0) {
      if (fVar25 <= 0.0) {
        rs.optionalValue._0_8_ = 0;
        rInterface.bottom = (IdealDiffuseBxDF *)0x0;
        rs.optionalValue._8_8_ = pIVar1;
      }
      else {
        rs.optionalValue._8_8_ = 0;
        rInterface.top =
             &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0)->top;
        rs.optionalValue._0_8_ = this;
      }
      fVar14 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      fVar15 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      auVar23._0_4_ = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      auVar3 = local_108;
      auVar23._4_60_ = extraout_var_02;
      auVar6._4_4_ = extraout_XMM0_Db_02;
      auVar6._0_4_ = fVar15;
      auVar6._8_4_ = extraout_XMM0_Dc_02;
      auVar6._12_4_ = extraout_XMM0_Dd_02;
      auVar13 = vinsertps_avx(auVar6,auVar23._0_16_,0x10);
      wo_03.super_Tuple3<pbrt::Vector3,_float>.z = fVar25;
      wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_108._0_4_;
      wo_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
      local_108 = auVar3;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                (&wos,(TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)&rs,
                 wo_03,fVar14,(Point2f)auVar13._0_8_,mode,All);
      if (wos.set == true) {
        pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
        bVar9 = SampledSpectrum::operator_cast_to_bool(&pBVar11->f);
        if (bVar9) {
          pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
          if ((pBVar11->pdf != 0.0) || (NAN(pBVar11->pdf))) {
            pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
            fVar14 = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.z;
            if (((fVar14 != 0.0) || (NAN(fVar14))) &&
               (pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos),
               (pBVar11->flags & Reflection) == Unset)) {
              fVar14 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
              fVar15 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
              auVar24._0_4_ = PDF::anon_class_8_1_ba1d750b::operator()(&r);
              auVar24._4_60_ = extraout_var_03;
              auVar7._4_4_ = extraout_XMM0_Db_03;
              auVar7._0_4_ = fVar15;
              auVar7._8_4_ = extraout_XMM0_Dc_03;
              auVar7._12_4_ = extraout_XMM0_Dd_03;
              auVar13 = vinsertps_avx(auVar7,auVar24._0_16_,0x10);
              wo_04.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_168;
              wo_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_148;
              wo_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_148._4_4_;
              TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                        (&wis,&rInterface,wo_04,fVar14,(Point2f)auVar13._0_8_,
                         (uint)(mode == Radiance),All);
              if (wis.set == true) {
                pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
                bVar9 = SampledSpectrum::operator_cast_to_bool(&pBVar11->f);
                if (bVar9) {
                  pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
                  if ((pBVar11->pdf != 0.0) || (NAN(pBVar11->pdf))) {
                    pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
                    fVar14 = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                    if (((fVar14 != 0.0) || (NAN(fVar14))) &&
                       (pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wis),
                       (pBVar11->flags & Reflection) == Unset)) {
                      BVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::Flags((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                        *)&rs);
                      if ((BVar10 & Specular) == Unset) {
                        BVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                 ::Flags(&rInterface);
                        if ((BVar10 & Specular) == Unset) {
                          pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                          VVar27 = Tuple3<pbrt::Vector3,_float>::operator-
                                             (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
                          auVar13 = local_108;
                          wo_05.super_Tuple3<pbrt::Vector3,_float>.z = fVar25;
                          wo_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_108._0_4_;
                          wo_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
                          local_108 = auVar13;
                          FVar16 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                   ::PDF((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                          *)&rs,wo_05,
                                         (Vector3f)VVar27.super_Tuple3<pbrt::Vector3,_float>,mode,
                                         All);
                          pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
                          VVar27 = Tuple3<pbrt::Vector3,_float>::operator-
                                             (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
                          wi_03.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_168;
                          wi_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_148;
                          wi_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_148._4_4_;
                          FVar17 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                   ::PDF(&rInterface,
                                         (Vector3f)VVar27.super_Tuple3<pbrt::Vector3,_float>,wi_03,
                                         mode,All);
                          fVar14 = (FVar17 + FVar16) * 0.5;
                          goto LAB_0040498c;
                        }
                        pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                        wi_00 = (Tuple3<pbrt::Vector3,_float>)
                                Tuple3<pbrt::Vector3,_float>::operator-
                                          (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
                        auVar13 = local_108;
                        wo_06.z = fVar25;
                        wo_06.x = (float)local_108._0_4_;
                        wo_06.y = (float)local_108._4_4_;
                        this_01 = &rs;
                        local_108 = auVar13;
                      }
                      else {
                        pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
                        wo_06 = (Tuple3<pbrt::Vector3,_float>)
                                Tuple3<pbrt::Vector3,_float>::operator-
                                          (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
                        wi_00.z = (float)local_168;
                        wi_00.x = (float)(undefined4)local_148;
                        wi_00.y = (float)local_148._4_4_;
                        this_01 = (optional<pbrt::BSDFSample> *)&rInterface;
                      }
                      fVar14 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::PDF((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                      *)this_01,(Vector3f)wo_06,(Vector3f)wi_00,mode,All);
                      goto LAB_0040498c;
                    }
                  }
                }
              }
              goto LAB_004049ea;
            }
          }
        }
      }
    }
    else {
      local_128.top = (DielectricInterfaceBxDF *)0x0;
      local_128.bottom = (IdealDiffuseBxDF *)0x0;
      if (fVar25 <= 0.0) {
        rInterface.bottom = (IdealDiffuseBxDF *)0x0;
        local_128.bottom = pIVar1;
      }
      else {
        rInterface.top = (DielectricInterfaceBxDF *)0x0;
        local_128.top = &this->top;
      }
      wos.set = false;
      wis.set = false;
      fVar14 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      fVar15 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      auVar20._0_4_ = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      auVar3 = local_108;
      auVar20._4_60_ = extraout_var;
      auVar4._4_4_ = extraout_XMM0_Db;
      auVar4._0_4_ = fVar15;
      auVar4._8_4_ = extraout_XMM0_Dc;
      auVar4._12_4_ = extraout_XMM0_Dd;
      auVar13 = vinsertps_avx(auVar4,auVar20._0_16_,0x10);
      wo_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar25;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_108._0_4_;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
      local_108 = auVar3;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                (&rs,&local_128,wo_01,fVar14,(Point2f)auVar13._0_8_,mode,Transmission);
      pstd::optional<pbrt::BSDFSample>::operator=(&wos,&rs);
      pstd::optional<pbrt::BSDFSample>::~optional(&rs);
      fVar14 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      fVar15 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      auVar21._0_4_ = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      auVar21._4_60_ = extraout_var_00;
      auVar5._4_4_ = extraout_XMM0_Db_00;
      auVar5._0_4_ = fVar15;
      auVar5._8_4_ = extraout_XMM0_Dc_00;
      auVar5._12_4_ = extraout_XMM0_Dd_00;
      auVar13 = vinsertps_avx(auVar5,auVar21._0_16_,0x10);
      wo_02.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_168;
      wo_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_148;
      wo_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_148._4_4_;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                (&rs,&local_128,wo_02,fVar14,(Point2f)auVar13._0_8_,(uint)(mode == Radiance),
                 Transmission);
      pstd::optional<pbrt::BSDFSample>::operator=(&wis,&rs);
      pstd::optional<pbrt::BSDFSample>::~optional(&rs);
      if (wos.set == true) {
        pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
        bVar9 = SampledSpectrum::operator_cast_to_bool(&pBVar11->f);
        if (((bVar9) &&
            (pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos), 0.0 < pBVar11->pdf)) &&
           (wis.set == true)) {
          pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wis);
          bVar9 = SampledSpectrum::operator_cast_to_bool(&pBVar11->f);
          if ((bVar9) &&
             (pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wis), 0.0 < pBVar11->pdf)) {
            bVar9 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                    IsNonSpecular(&local_128);
            if (bVar9) {
              pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
              VVar27 = Tuple3<pbrt::Vector3,_float>::operator-
                                 (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
              fVar14 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
              fVar15 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
              auVar22._0_4_ = PDF::anon_class_8_1_ba1d750b::operator()(&r);
              auVar22._4_60_ = extraout_var_01;
              auVar8._4_4_ = extraout_XMM0_Db_01;
              auVar8._0_4_ = fVar15;
              auVar8._8_4_ = extraout_XMM0_Dc_01;
              auVar8._12_4_ = extraout_XMM0_Dd_01;
              auVar13 = vinsertps_avx(auVar8,auVar22._0_16_,0x10);
              TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                        (&rs,&rInterface,(Vector3f)VVar27.super_Tuple3<pbrt::Vector3,_float>,fVar14,
                         (Point2f)auVar13._0_8_,mode,All);
              if (rs.set == true) {
                pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&rs);
                bVar9 = SampledSpectrum::operator_cast_to_bool(&pBVar11->f);
                if (bVar9) {
                  pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&rs);
                  if ((pBVar11->pdf != 0.0) || (NAN(pBVar11->pdf))) {
                    bVar9 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                            IsNonSpecular(&rInterface);
                    if (bVar9) {
                      pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&rs);
                      VVar27 = Tuple3<pbrt::Vector3,_float>::operator-
                                         (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
                      wi_02.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_168;
                      wi_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_148;
                      wi_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_148._4_4_;
                      FVar16 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::PDF(&local_128,(Vector3f)VVar27.super_Tuple3<pbrt::Vector3,_float>,
                                     wi_02,mode,All);
                      pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&rs);
                      fVar14 = pBVar11->pdf;
                      pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
                      VVar27 = Tuple3<pbrt::Vector3,_float>::operator-
                                         (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
                      pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                      VVar28 = Tuple3<pbrt::Vector3,_float>::operator-
                                         (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
                      FVar17 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::PDF(&rInterface,(Vector3f)VVar27.super_Tuple3<pbrt::Vector3,_float>
                                     ,(Vector3f)VVar28.super_Tuple3<pbrt::Vector3,_float>,mode,All);
                      pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                      fVar14 = fVar14 * fVar14;
                      auVar18._0_4_ = fVar14 / (FVar16 * FVar16 + fVar14);
                      auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
                      auVar13 = vfmadd213ss_fma(auVar18,ZEXT416((uint)FVar16),
                                                ZEXT416((uint)local_1ac));
                      fVar14 = pBVar11->pdf * pBVar11->pdf;
                      auVar26._0_4_ = fVar14 / (FVar17 * FVar17 + fVar14);
                      auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
                      auVar13 = vfmadd213ss_fma(auVar26,ZEXT416((uint)FVar17),auVar13);
                      local_1ac = auVar13._0_4_;
                    }
                    else {
                      pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&rs);
                      VVar27 = Tuple3<pbrt::Vector3,_float>::operator-
                                         (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
                      wi_04.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_168;
                      wi_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_148;
                      wi_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_148._4_4_;
                      FVar16 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::PDF(&local_128,(Vector3f)VVar27.super_Tuple3<pbrt::Vector3,_float>,
                                     wi_04,mode,All);
                      local_1ac = local_1ac + FVar16;
                    }
                  }
                }
              }
              pstd::optional<pbrt::BSDFSample>::~optional(&rs);
            }
            else {
              pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wos);
              VVar27 = Tuple3<pbrt::Vector3,_float>::operator-
                                 (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
              pBVar11 = pstd::optional<pbrt::BSDFSample>::value(&wis);
              VVar28 = Tuple3<pbrt::Vector3,_float>::operator-
                                 (&(pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>);
              fVar14 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                                 (&rInterface,(Vector3f)VVar27.super_Tuple3<pbrt::Vector3,_float>,
                                  (Vector3f)VVar28.super_Tuple3<pbrt::Vector3,_float>,mode,All);
LAB_0040498c:
              local_1ac = local_1ac + fVar14;
            }
          }
        }
      }
LAB_004049ea:
      pstd::optional<pbrt::BSDFSample>::~optional(&wis);
    }
    pstd::optional<pbrt::BSDFSample>::~optional(&wos);
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Return approximate PDF for layered BSDF
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        // Update _pdfSum_ for reflection at the entrance layer
        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        if (SameHemisphere(wo, wi)) {
            auto reflFlag = BxDFReflTransFlags::Reflection;
            pdfSum += enteredTop ? config.nSamples * top.PDF(wo, wi, mode, reflFlag)
                                 : config.nSamples * bottom.PDF(wo, wi, mode, reflFlag);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                auto trans = BxDFReflTransFlags::Transmission;
                pstd::optional<BSDFSample> wos, wis;
                wos = tInterface.Sample_f(wo, r(), {r(), r()}, mode, trans);
                wis = tInterface.Sample_f(wi, r(), {r(), r()}, !mode, trans);

                // Update _pdfSum_ accounting for TRT scattering events
                if (wos && wos->f && wos->pdf > 0 && wis && wis->f && wis->pdf > 0) {
                    if (!tInterface.IsNonSpecular())
                        pdfSum += rInterface.PDF(-wos->wi, -wis->wi, mode);
                    else {
                        // Use multiple importance sampling to estimate PDF product
                        pstd::optional<BSDFSample> rs =
                            rInterface.Sample_f(-wos->wi, r(), {r(), r()}, mode);
                        if (!rs || !rs->f || rs->pdf == 0)
                            ;
                        else if (!rInterface.IsNonSpecular())
                            pdfSum += tInterface.PDF(-rs->wi, wi, mode);
                        else {
                            // Actual MIS here
                            // first, sample r -> r cancels
                            Float tPDF = tInterface.PDF(-rs->wi, wi, mode);
                            Float wt = PowerHeuristic(1, rs->pdf, 1, tPDF);
                            pdfSum += wt * tPDF;

                            Float rPDF = rInterface.PDF(-wos->wi, -wis->wi, mode);
                            wt = PowerHeuristic(1, wis->pdf, 1, rPDF);
                            pdfSum += wt * rPDF;
                        }
                    }
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                pstd::optional<BSDFSample> wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0 ||
                    wos->IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                pstd::optional<BSDFSample> wis = tiInterface.Sample_f(wi, uc, u, !mode);
                if (!wis || !wos->f || wos->pdf == 0 || wos->wi.z == 0 ||
                    wis->IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos->wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis->wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis->wi, mode) +
                               tiInterface.PDF(-wos->wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(0.9f, 1 / (4 * Pi), pdfSum / config.nSamples);
    }